

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

int fy_emit_increase_indent(fy_emitter *emit,int flags,int indent)

{
  int iVar1;
  int local_24;
  int indent_local;
  int flags_local;
  fy_emitter *emit_local;
  
  if (indent < 0) {
    if ((flags & 0x10U) == 0) {
      local_24 = 0;
    }
    else {
      local_24 = fy_emit_indent(emit);
    }
    emit_local._4_4_ = local_24;
  }
  else {
    emit_local._4_4_ = indent;
    if ((flags & 0x20U) == 0) {
      iVar1 = fy_emit_indent(emit);
      emit_local._4_4_ = indent + iVar1;
    }
  }
  return emit_local._4_4_;
}

Assistant:

int fy_emit_increase_indent(struct fy_emitter *emit, int flags, int indent) {
    if (indent < 0)
        return (flags & DDNF_FLOW) ? fy_emit_indent(emit) : 0;

    if (!(flags & DDNF_INDENTLESS))
        return indent + fy_emit_indent(emit);

    return indent;
}